

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall QPDFParser::fixMissingKeys(QPDFParser *this)

{
  StackFrame *pSVar1;
  qpdf_offset_t offset;
  undefined8 uVar2;
  bool bVar3;
  qpdf_object_type_e qVar4;
  int iVar5;
  element_type *peVar6;
  size_type sVar7;
  size_type sVar8;
  mapped_type *this_00;
  bool local_181;
  int local_154;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  bool local_129;
  undefined1 local_128 [7];
  bool found_fake;
  undefined1 local_108 [8];
  string key;
  QPDFObjectHandle *item;
  iterator __end1_1;
  iterator __begin1_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1_1;
  int next_fake_key;
  QPDFObjectHandle local_b0;
  string local_a0;
  QPDFObjectHandle local_70;
  reference local_60;
  QPDFObjectHandle *obj;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  QPDFParser *this_local;
  
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  pSVar1 = this->frame;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(&pSVar1->olist);
  obj = (QPDFObjectHandle *)
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(&pSVar1->olist);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&obj), bVar3) {
    local_60 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
    QPDFObjectHandle::getObj(&local_70);
    peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&local_70);
    qVar4 = QPDFObject::getTypeCode(peVar6);
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_70);
    if (qVar4 == ot_name) {
      QPDFObjectHandle::getObj(&local_b0);
      peVar6 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_b0);
      QPDFObject::getStringValue_abi_cxx11_(&local_a0,peVar6);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_b0);
    }
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  __range1_1._4_4_ = 1;
  pSVar1 = this->frame;
  __end1_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(&pSVar1->olist)
  ;
  item = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(&pSVar1->olist);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                             *)&item), bVar3) {
    key.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
         ::operator*(&__end1_1);
    do {
      iVar5 = __range1_1._4_4_ + 1;
      std::__cxx11::to_string((string *)local_128,__range1_1._4_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "/QPDFFake",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
      ;
      std::__cxx11::string::~string((string *)local_128);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::count(&this->frame->dict,(key_type *)local_108);
      local_181 = false;
      if (sVar7 == 0) {
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1,(key_type *)local_108);
        local_181 = sVar8 == 0;
      }
      local_129 = local_181;
      QTC::TC("qpdf","QPDFParser found fake",(byte)~local_181 & 1);
      if ((local_129 & 1U) == 0) {
        local_154 = 0;
      }
      else {
        offset = this->frame->offset;
        std::operator+(&local_150,
                       "expected dictionary key but found non-name object; inserting key ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        warn(this,offset,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        uVar2 = key.field_2._8_8_;
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[](&this->frame->dict,(key_type *)local_108);
        QPDFObjectHandle::operator=(this_00,(QPDFObjectHandle *)uVar2);
        local_154 = 7;
      }
      std::__cxx11::string::~string((string *)local_108);
      __range1_1._4_4_ = iVar5;
    } while (local_154 == 0);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1_1);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void
QPDFParser::fixMissingKeys()
{
    std::set<std::string> names;
    for (auto& obj: frame->olist) {
        if (obj.getObj()->getTypeCode() == ::ot_name) {
            names.insert(obj.getObj()->getStringValue());
        }
    }
    int next_fake_key = 1;
    for (auto const& item: frame->olist) {
        while (true) {
            const std::string key = "/QPDFFake" + std::to_string(next_fake_key++);
            const bool found_fake = frame->dict.count(key) == 0 && names.count(key) == 0;
            QTC::TC("qpdf", "QPDFParser found fake", (found_fake ? 0 : 1));
            if (found_fake) {
                warn(
                    frame->offset,
                    "expected dictionary key but found non-name object; inserting key " + key);
                frame->dict[key] = item;
                break;
            }
        }
    }
}